

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corr.hpp
# Opt level: O2

void duckdb::CorrOperation::Finalize<double,duckdb::CorrState>
               (CorrState *state,double *target,AggregateFinalizeData *finalize_data)

{
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  OutOfRangeException *pOVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  allocator local_69;
  double local_68;
  double local_60;
  string local_58;
  double local_38;
  undefined8 uStack_30;
  
  uVar1 = (state->cov_pop).count;
  if (((uVar1 == 0) || (uVar2 = (state->dev_pop_x).count, uVar2 == 0)) ||
     ((state->dev_pop_y).count == 0)) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  local_38 = (state->cov_pop).co_moment;
  uStack_30 = 0;
  local_60 = 0.0;
  if (uVar2 != 1) {
    auVar7._8_4_ = (int)(uVar2 >> 0x20);
    auVar7._0_8_ = uVar2;
    auVar7._12_4_ = 0x45300000;
    local_60 = (state->dev_pop_x).dsquared /
               ((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
    if (local_60 < 0.0) {
      local_60 = sqrt(local_60);
    }
    else {
      local_60 = SQRT(local_60);
    }
  }
  bVar3 = Value::DoubleIsFinite(local_60);
  if (bVar3) {
    uVar5 = (state->dev_pop_y).count;
    local_68 = 0.0;
    if (1 < uVar5) {
      auVar8._8_4_ = (int)(uVar5 >> 0x20);
      auVar8._0_8_ = uVar5;
      auVar8._12_4_ = 0x45300000;
      local_68 = (state->dev_pop_y).dsquared /
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
      if (local_68 < 0.0) {
        local_68 = sqrt(local_68);
      }
      else {
        local_68 = SQRT(local_68);
      }
    }
    bVar3 = Value::DoubleIsFinite(local_68);
    if (bVar3) {
      auVar6._8_4_ = (int)(uVar1 >> 0x20);
      auVar6._0_8_ = uVar1;
      auVar6._12_4_ = 0x45300000;
      uVar5 = -(ulong)(local_60 * local_68 != 0.0);
      *target = (double)(~uVar5 & 0x7ff8000000000000 |
                        (ulong)((local_38 /
                                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) /
                               (local_60 * local_68)) & uVar5);
      return;
    }
    pOVar4 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_58,"STDDEV_POP for Y is out of range!",&local_69);
    OutOfRangeException::OutOfRangeException(pOVar4,&local_58);
    __cxa_throw(pOVar4,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pOVar4 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_58,"STDDEV_POP for X is out of range!",&local_69);
  OutOfRangeException::OutOfRangeException(pOVar4,&local_58);
  __cxa_throw(pOVar4,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.cov_pop.count == 0 || state.dev_pop_x.count == 0 || state.dev_pop_y.count == 0) {
			finalize_data.ReturnNull();
		} else {
			auto cov = state.cov_pop.co_moment / state.cov_pop.count;
			auto std_x = state.dev_pop_x.count > 1 ? sqrt(state.dev_pop_x.dsquared / state.dev_pop_x.count) : 0;
			if (!Value::DoubleIsFinite(std_x)) {
				throw OutOfRangeException("STDDEV_POP for X is out of range!");
			}
			auto std_y = state.dev_pop_y.count > 1 ? sqrt(state.dev_pop_y.dsquared / state.dev_pop_y.count) : 0;
			if (!Value::DoubleIsFinite(std_y)) {
				throw OutOfRangeException("STDDEV_POP for Y is out of range!");
			}
			target = std_x * std_y != 0 ? cov / (std_x * std_y) : NAN;
		}
	}